

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O3

void __thiscall
cbtAlignedObjectArray<cbtPersistentManifold_*>::
quickSortInternal<cbtPersistentManifoldSortPredicate>
          (cbtAlignedObjectArray<cbtPersistentManifold_*> *this,
          cbtPersistentManifoldSortPredicate *CompareFunc,int lo,int hi)

{
  int iVar1;
  cbtPersistentManifold *pcVar2;
  cbtPersistentManifold **ppcVar3;
  cbtPersistentManifold *pcVar4;
  cbtPersistentManifold *pcVar5;
  int iVar6;
  int hi_00;
  int iVar7;
  int iVar8;
  long lVar9;
  cbtPersistentManifold *temp;
  int iVar10;
  long lVar11;
  
  do {
    pcVar2 = this->m_data[(lo + hi) / 2];
    iVar7 = lo;
    hi_00 = hi;
    do {
      ppcVar3 = this->m_data;
      lVar9 = (long)iVar7 + -1;
      iVar1 = pcVar2->m_body0->m_islandTag1;
      iVar6 = iVar7;
      do {
        iVar7 = iVar6;
        pcVar4 = ppcVar3[lVar9 + 1];
        iVar10 = pcVar4->m_body0->m_islandTag1;
        if (iVar10 < 0) {
          iVar10 = pcVar4->m_body1->m_islandTag1;
        }
        iVar8 = iVar1;
        if (iVar1 < 0) {
          iVar8 = pcVar2->m_body1->m_islandTag1;
        }
        lVar9 = lVar9 + 1;
        iVar6 = iVar7 + 1;
      } while (iVar10 < iVar8);
      lVar11 = (long)hi_00 + 1;
      iVar6 = hi_00;
      do {
        hi_00 = iVar6;
        iVar10 = iVar1;
        if (iVar1 < 0) {
          iVar10 = pcVar2->m_body1->m_islandTag1;
        }
        pcVar5 = ppcVar3[lVar11 + -1];
        iVar8 = pcVar5->m_body0->m_islandTag1;
        if (iVar8 < 0) {
          iVar8 = pcVar5->m_body1->m_islandTag1;
        }
        lVar11 = lVar11 + -1;
        iVar6 = hi_00 + -1;
      } while (iVar10 < iVar8);
      if (lVar9 <= lVar11) {
        ppcVar3[lVar9] = pcVar5;
        this->m_data[lVar11] = pcVar4;
        iVar7 = iVar7 + 1;
        hi_00 = hi_00 + -1;
      }
    } while (iVar7 <= hi_00);
    if (lo < hi_00) {
      quickSortInternal<cbtPersistentManifoldSortPredicate>(this,CompareFunc,lo,hi_00);
    }
    lo = iVar7;
  } while (iVar7 < hi);
  return;
}

Assistant:

void quickSortInternal(const L& CompareFunc, int lo, int hi)
	{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
		int i = lo, j = hi;
		T x = m_data[(lo + hi) / 2];

		//  partition
		do
		{
			while (CompareFunc(m_data[i], x))
				i++;
			while (CompareFunc(x, m_data[j]))
				j--;
			if (i <= j)
			{
				swap(i, j);
				i++;
				j--;
			}
		} while (i <= j);

		//  recursion
		if (lo < j)
			quickSortInternal(CompareFunc, lo, j);
		if (i < hi)
			quickSortInternal(CompareFunc, i, hi);
	}